

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParsePrefix(State *state)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  
LAB_00112426:
  bVar2 = false;
LAB_00112428:
  if (0 < state->nest_level) {
    MaybeAppend(state,"::");
  }
  bVar1 = ParseTemplateParam(state);
  if ((!bVar1) && (bVar1 = ParseSubstitution(state), !bVar1)) {
    bVar1 = ParseUnscopedName(state);
    pcVar3 = (char *)(ulong)bVar1;
    if (!bVar1) goto LAB_00112472;
  }
  bVar2 = true;
  if (-1 < state->nest_level) {
    state->nest_level = state->nest_level + 1;
  }
  goto LAB_00112428;
LAB_00112472:
  if (((0 < state->nest_level) && (state->append == true)) &&
     (pcVar3 = state->out_cur + -2, state->out_begin <= pcVar3)) {
    state->out_cur = pcVar3;
    *pcVar3 = '\0';
  }
  if (!bVar2) {
    return (bool)(char)pcVar3;
  }
  bVar2 = ParseTemplateArgs(state);
  if (!bVar2) {
    return bVar2;
  }
  goto LAB_00112426;
}

Assistant:

static bool ParsePrefix(State *state) {
  bool has_something = false;
  while (true) {
    MaybeAppendSeparator(state);
    if (ParseTemplateParam(state) ||
        ParseSubstitution(state) ||
        ParseUnscopedName(state)) {
      has_something = true;
      MaybeIncreaseNestLevel(state);
      continue;
    }
    MaybeCancelLastSeparator(state);
    if (has_something && ParseTemplateArgs(state)) {
      return ParsePrefix(state);
    } else {
      break;
    }
  }
  return true;
}